

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O2

void nn_btcp_start_accepting(nn_btcp *self)

{
  nn_atcp *self_00;
  
  if (self->atcp == (nn_atcp *)0x0) {
    self_00 = (nn_atcp *)nn_alloc_(0x730);
    self->atcp = self_00;
    if (self_00 != (nn_atcp *)0x0) {
      nn_atcp_init(self_00,2,self->ep,&self->fsm);
      nn_atcp_start(self->atcp,&self->usock);
      return;
    }
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
            ,0x194);
  }
  else {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","self->atcp == NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
            ,400);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_btcp_start_accepting (struct nn_btcp *self)
{
    nn_assert (self->atcp == NULL);

    /*  Allocate new atcp state machine. */
    self->atcp = nn_alloc (sizeof (struct nn_atcp), "atcp");
    alloc_assert (self->atcp);
    nn_atcp_init (self->atcp, NN_BTCP_SRC_ATCP, self->ep, &self->fsm);

    /*  Start waiting for a new incoming connection. */
    nn_atcp_start (self->atcp, &self->usock);
}